

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_accept_op.hpp
# Opt level: O0

void __thiscall
webfront::http::std::experimental::net::v1::detail::
reactive_socket_accept_op_base<std::experimental::net::v1::basic_stream_socket<std::experimental::net::v1::ip::tcp>,_std::experimental::net::v1::ip::tcp>
::do_assign(reactive_socket_accept_op_base<std::experimental::net::v1::basic_stream_socket<std::experimental::net::v1::ip::tcp>,_std::experimental::net::v1::ip::tcp>
            *this)

{
  bool bVar1;
  socket_type sVar2;
  error_code *in_RDI;
  native_handle_type *unaff_retaddr;
  protocol_type *in_stack_00000008;
  basic_socket<std::experimental::net::v1::ip::tcp> *in_stack_00000010;
  size_t in_stack_ffffffffffffffd8;
  basic_endpoint<std::experimental::net::v1::ip::tcp> *in_stack_ffffffffffffffe0;
  error_code *ec;
  
  ec = in_RDI;
  sVar2 = socket_holder::get((socket_holder *)(in_RDI + 4));
  if (sVar2 != -1) {
    if (in_RDI[5]._M_cat != (error_category *)0x0) {
      ip::basic_endpoint<std::experimental::net::v1::ip::tcp>::resize
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    }
    socket_holder::get((socket_holder *)(in_RDI + 4));
    basic_socket<std::experimental::net::v1::ip::tcp>::assign
              (in_stack_00000010,in_stack_00000008,unaff_retaddr,ec);
    bVar1 = ::std::error_code::operator_cast_to_bool((error_code *)&in_RDI[1]._M_cat);
    if (!bVar1) {
      socket_holder::release((socket_holder *)(in_RDI + 4));
    }
  }
  return;
}

Assistant:

void do_assign()
  {
    if (new_socket_.get() != invalid_socket)
    {
      if (peer_endpoint_)
        peer_endpoint_->resize(addrlen_);
      peer_.assign(protocol_, new_socket_.get(), ec_);
      if (!ec_)
        new_socket_.release();
    }
  }